

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

string * __thiscall
CFG::findNewUnusedVariableLetter_abi_cxx11_(string *__return_storage_ptr__,CFG *this)

{
  bool bVar1;
  char c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  c = 'A';
  while( true ) {
    toString_abi_cxx11_(&local_50,c);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_68,&this->nonTerminalsV);
    bVar1 = inVector(&local_50,&local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar1) break;
    c = c + '\x01';
  }
  toString_abi_cxx11_(__return_storage_ptr__,c);
  return __return_storage_ptr__;
}

Assistant:

std::string CFG::findNewUnusedVariableLetter() {
    char newVariable = 'A';
    while (inVector(toString(newVariable), nonTerminalsV)) { newVariable++; }
    return toString(newVariable);
}